

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void tinyexr::wdec14(unsigned_short l,unsigned_short h,unsigned_short *a,unsigned_short *b)

{
  unsigned_short uVar1;
  short bs;
  short as;
  int ai;
  int hi;
  short hs;
  short ls;
  unsigned_short *b_local;
  unsigned_short *a_local;
  unsigned_short h_local;
  unsigned_short l_local;
  
  uVar1 = l + (h & 1) + ((short)h >> 1);
  *a = uVar1;
  *b = uVar1 - h;
  return;
}

Assistant:

inline void wdec14(unsigned short l, unsigned short h, unsigned short &a,
                   unsigned short &b) {
  short ls = static_cast<short>(l);
  short hs = static_cast<short>(h);

  int hi = hs;
  int ai = ls + (hi & 1) + (hi >> 1);

  short as = static_cast<short>(ai);
  short bs = static_cast<short>(ai - hi);

  a = static_cast<unsigned short>(as);
  b = static_cast<unsigned short>(bs);
}